

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O3

void __thiscall
SuiteSessionTests::
initiatorFixtureInvalidRawFixTMessage_LogonMessageHeaderOrderInvalid_InvalidMessageExceptionHelper::
RunImpl(initiatorFixtureInvalidRawFixTMessage_LogonMessageHeaderOrderInvalid_InvalidMessageExceptionHelper
        *this)

{
  string *beginString;
  undefined1 *targetCompID;
  undefined1 *puVar1;
  string *psVar2;
  TestResults *this_00;
  DataDictionary *pDVar3;
  Session *pSVar4;
  long *plVar5;
  TestResults **ppTVar6;
  TestDetails **ppTVar7;
  long *plVar8;
  size_type *psVar9;
  string newOrderSingleRawFIX;
  string delimSOH;
  undefined1 local_df0 [32];
  shared_ptr<FIX::DataDictionary> pDataDictionary;
  long *local_dc0;
  long local_db8;
  long local_db0;
  long lStack_da8;
  long *local_da0;
  long local_d98;
  long local_d90;
  long lStack_d88;
  long *local_d80;
  long local_d78;
  long local_d70;
  long lStack_d68;
  long *local_d60;
  long local_d58;
  long local_d50;
  long lStack_d48;
  long *local_d40;
  long local_d38;
  long local_d30;
  long lStack_d28;
  long *local_d20;
  long local_d18;
  long local_d10;
  long lStack_d08;
  long *local_d00;
  long local_cf8;
  long local_cf0;
  long lStack_ce8;
  long *local_ce0;
  long local_cd8;
  long local_cd0;
  long lStack_cc8;
  long *local_cc0;
  long local_cb8;
  long local_cb0;
  long lStack_ca8;
  long *local_ca0;
  long local_c98;
  long local_c90;
  long lStack_c88;
  long *local_c80;
  long local_c78;
  long local_c70;
  long lStack_c68;
  long *local_c60;
  long local_c58;
  long local_c50;
  long lStack_c48;
  size_type *local_c40;
  char *local_c38;
  size_type sStack_c30;
  long lStack_c28;
  element_type *local_c20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c18;
  element_type *local_c10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c08;
  long *local_c00;
  long local_bf8;
  long local_bf0;
  long lStack_be8;
  long *local_be0;
  long local_bd8;
  long local_bd0;
  long lStack_bc8;
  long *local_bc0;
  long local_bb8;
  long local_bb0;
  long lStack_ba8;
  long *local_ba0;
  long local_b98;
  long local_b90;
  long lStack_b88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b80;
  TimeRange sessionTime;
  long local_b58;
  long local_b50 [6];
  NewOrderSingle newOrderSingle;
  SessionID sessionID;
  DataDictionary dictionary;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_850;
  char local_840 [16];
  _Alloc_hider local_830;
  size_type local_828;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_820;
  size_t local_810;
  int local_808;
  DataDictionaryProvider provider;
  
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTimeStamp.
  super_DateTime.m_date = 0x257e44;
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTimeStamp.
  super_DateTime.m_time = 0x1aa324d61000;
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTimeStamp.super_DateTime
  .m_date = 0x268636;
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTimeStamp.super_DateTime
  .m_time = 0x354649ac2000;
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
  m_date = 0;
  *(undefined8 *)
   &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
    field_0xc = *(undefined8 *)
                 &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.
                  startTimeStamp.super_DateTime.field_0xc;
  *(undefined4 *)
   ((long)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTime.
           super_DateTime.m_time + 4) =
       *(undefined4 *)
        ((long)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.
                startTimeStamp.super_DateTime.m_time + 4);
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
  m_date = 0;
  *(undefined8 *)
   &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
    field_0xc = *(undefined8 *)
                 &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.
                  endTimeStamp.super_DateTime.field_0xc;
  *(undefined4 *)
   ((long)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTime.
           super_DateTime.m_time + 4) =
       *(undefined4 *)
        ((long)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTimeStamp.
                super_DateTime.m_time + 4);
  _sessionTime = local_b50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sessionTime,"FIXT.1.1","");
  beginString = (string *)
                &provider.m_transportDictionaries._M_t._M_impl.super__Rb_tree_header._M_header.
                 _M_parent;
  provider.m_transportDictionaries._M_t._M_impl._0_8_ = &PTR__FieldBase_00323d68;
  provider.m_transportDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 8;
  provider.m_transportDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       &provider.m_transportDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
  std::__cxx11::string::_M_construct<char*>
            ((string *)beginString,_sessionTime,local_b58 + (long)_sessionTime);
  provider.m_applicationDictionaries._M_t._M_impl._0_8_ =
       &provider.m_applicationDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  provider.m_applicationDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  provider.m_applicationDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  provider.m_applicationDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ =
       0;
  provider.m_applicationDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  provider.m_applicationDictionaries._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
  provider.m_transportDictionaries._M_t._M_impl._0_8_ = &PTR__FieldBase_00324750;
  newOrderSingleRawFIX._M_dataplus._M_p = (pointer)&newOrderSingleRawFIX.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&newOrderSingleRawFIX,"TW","");
  _dictionary = &PTR__FieldBase_00323d68;
  local_850._M_allocated_capacity = (size_type)local_840;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_850,newOrderSingleRawFIX._M_dataplus._M_p,
             newOrderSingleRawFIX._M_dataplus._M_p + newOrderSingleRawFIX._M_string_length);
  local_830._M_p = (pointer)&local_820;
  local_828 = 0;
  local_820._M_local_buf[0] = '\0';
  local_810 = 0;
  local_808 = 0;
  _dictionary = &PTR__FieldBase_00324108;
  delimSOH._M_dataplus._M_p = (pointer)&delimSOH.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&delimSOH,"ISLD","");
  targetCompID = &newOrderSingle.super_Message.field_0x10;
  newOrderSingle.super_Message._0_8_ = &PTR__FieldBase_00323d68;
  newOrderSingle.super_Message._8_4_ = 0x38;
  newOrderSingle.super_Message._16_8_ = &newOrderSingle.super_Message.field_0x20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)targetCompID,delimSOH._M_dataplus._M_p,
             delimSOH._M_dataplus._M_p + delimSOH._M_string_length);
  puVar1 = &newOrderSingle.super_Message.field_0x40;
  newOrderSingle.super_Message._56_8_ = 0;
  newOrderSingle.super_Message._64_1_ = 0;
  newOrderSingle.super_Message._80_8_ = 0;
  newOrderSingle.super_Message._88_4_ = 0;
  newOrderSingle.super_Message._0_8_ = &PTR__FieldBase_00324980;
  local_df0._0_8_ = local_df0 + 0x10;
  newOrderSingle.super_Message._48_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_df0,"");
  FIX::SessionID::SessionID
            (&sessionID,beginString,(string *)&local_850,(string *)targetCompID,(string *)local_df0)
  ;
  if ((undefined1 *)local_df0._0_8_ != local_df0 + 0x10) {
    operator_delete((void *)local_df0._0_8_,local_df0._16_8_ + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)&newOrderSingle);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)delimSOH._M_dataplus._M_p != &delimSOH.field_2) {
    operator_delete(delimSOH._M_dataplus._M_p,delimSOH.field_2._M_allocated_capacity + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)&dictionary);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)newOrderSingleRawFIX._M_dataplus._M_p != &newOrderSingleRawFIX.field_2) {
    operator_delete(newOrderSingleRawFIX._M_dataplus._M_p,
                    CONCAT71(newOrderSingleRawFIX.field_2._M_allocated_capacity._1_7_,
                             newOrderSingleRawFIX.field_2._M_local_buf[0]) + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)&provider);
  if (_sessionTime != local_b50) {
    operator_delete(_sessionTime,local_b50[0] + 1);
  }
  FIX::TimeRange::TimeRange
            (&sessionTime,
             &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTime,
             &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTime,0,0x1f)
  ;
  FIX::DataDictionaryProvider::DataDictionaryProvider(&provider);
  _dictionary = (undefined **)&local_850;
  std::__cxx11::string::_M_construct<char_const*>((string *)&dictionary,"../spec/FIXT11.xml","");
  FIX::DataDictionaryProvider::addTransportDataDictionary
            (&provider,&sessionID.m_beginString,(string *)&dictionary);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_dictionary != &local_850) {
    operator_delete(_dictionary,(ulong)(local_850._M_allocated_capacity + 1));
  }
  pDVar3 = (DataDictionary *)
           FIX::DataDictionaryProvider::getSessionDataDictionary((BeginString *)&provider);
  FIX::DataDictionary::DataDictionary(&dictionary,pDVar3);
  pDataDictionary.super___shared_ptr<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<FIX::DataDictionary,std::allocator<FIX::DataDictionary>,FIX::DataDictionary&>
            (&pDataDictionary.super___shared_ptr<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(DataDictionary **)&pDataDictionary,
             (allocator<FIX::DataDictionary> *)&newOrderSingle,&dictionary);
  local_c10 = pDataDictionary.super___shared_ptr<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_c08 = pDataDictionary.super___shared_ptr<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (pDataDictionary.super___shared_ptr<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (pDataDictionary.super___shared_ptr<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (pDataDictionary.super___shared_ptr<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (pDataDictionary.super___shared_ptr<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (pDataDictionary.super___shared_ptr<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  FIX::DataDictionaryProvider::addTransportDataDictionary(&provider,&sessionID,&local_c10);
  if (local_c08 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c08);
  }
  newOrderSingleRawFIX._M_dataplus._M_p = (pointer)&newOrderSingleRawFIX.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&newOrderSingleRawFIX,"20","");
  newOrderSingle.super_Message._0_8_ = &PTR__FieldBase_00323d68;
  newOrderSingle.super_Message._8_4_ = 0x468;
  newOrderSingle.super_Message._16_8_ = &newOrderSingle.super_Message.field_0x20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&newOrderSingle.super_Message.field_0x10,
             newOrderSingleRawFIX._M_dataplus._M_p,
             newOrderSingleRawFIX._M_dataplus._M_p + newOrderSingleRawFIX._M_string_length);
  newOrderSingle.super_Message._56_8_ = 0;
  newOrderSingle.super_Message._64_1_ = 0;
  newOrderSingle.super_Message._80_8_ = 0;
  newOrderSingle.super_Message._88_4_ = 0;
  newOrderSingle.super_Message._0_8_ = &PTR__FieldBase_00323ce8;
  local_c20 = pDataDictionary.super___shared_ptr<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_c18 = pDataDictionary.super___shared_ptr<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (pDataDictionary.super___shared_ptr<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (pDataDictionary.super___shared_ptr<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (pDataDictionary.super___shared_ptr<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (pDataDictionary.super___shared_ptr<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (pDataDictionary.super___shared_ptr<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  newOrderSingle.super_Message._48_8_ = puVar1;
  FIX::DataDictionaryProvider::addApplicationDataDictionary(&provider,&newOrderSingle,&local_c20);
  if (local_c18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c18);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)&newOrderSingle);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)newOrderSingleRawFIX._M_dataplus._M_p != &newOrderSingleRawFIX.field_2) {
    operator_delete(newOrderSingleRawFIX._M_dataplus._M_p,
                    CONCAT71(newOrderSingleRawFIX.field_2._M_allocated_capacity._1_7_,
                             newOrderSingleRawFIX.field_2._M_local_buf[0]) + 1);
  }
  pSVar4 = (Session *)operator_new(0x848);
  FIX::Session::Session
            (pSVar4,&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.
                     super_NullApplication.super_Application,
             (MessageStoreFactory *)&(this->super_initiatorFixture).super_sessionFixture.factory,
             &sessionID,&provider,&sessionTime,1,(LogFactory *)0x0);
  (this->super_initiatorFixture).super_sessionFixture.object = pSVar4;
  newOrderSingleRawFIX._M_dataplus._M_p = (pointer)&newOrderSingleRawFIX.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&newOrderSingleRawFIX,"20","");
  newOrderSingle.super_Message._0_8_ = &PTR__FieldBase_00323d68;
  newOrderSingle.super_Message._8_4_ = 0x468;
  newOrderSingle.super_Message._16_8_ = &newOrderSingle.super_Message.field_0x20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&newOrderSingle.super_Message.field_0x10,
             newOrderSingleRawFIX._M_dataplus._M_p,
             newOrderSingleRawFIX._M_dataplus._M_p + newOrderSingleRawFIX._M_string_length);
  newOrderSingle.super_Message._56_8_ = 0;
  newOrderSingle.super_Message._64_1_ = 0;
  newOrderSingle.super_Message._80_8_ = 0;
  newOrderSingle.super_Message._88_4_ = 0;
  newOrderSingle.super_Message._0_8_ = &PTR__FieldBase_00323ce8;
  newOrderSingle.super_Message._48_8_ = puVar1;
  std::__cxx11::string::_M_assign((string *)(pSVar4 + 0x1f8));
  FIX::FieldBase::~FieldBase((FieldBase *)&newOrderSingle);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)newOrderSingleRawFIX._M_dataplus._M_p != &newOrderSingleRawFIX.field_2) {
    operator_delete(newOrderSingleRawFIX._M_dataplus._M_p,
                    CONCAT71(newOrderSingleRawFIX.field_2._M_allocated_capacity._1_7_,
                             newOrderSingleRawFIX.field_2._M_local_buf[0]) + 1);
  }
  pSVar4 = (this->super_initiatorFixture).super_sessionFixture.object;
  newOrderSingleRawFIX._M_dataplus._M_p = (pointer)&newOrderSingleRawFIX.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&newOrderSingleRawFIX,"20","");
  newOrderSingle.super_Message._0_8_ = &PTR__FieldBase_00323d68;
  newOrderSingle.super_Message._8_4_ = 0x468;
  newOrderSingle.super_Message._16_8_ = &newOrderSingle.super_Message.field_0x20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&newOrderSingle.super_Message.field_0x10,
             newOrderSingleRawFIX._M_dataplus._M_p,
             newOrderSingleRawFIX._M_dataplus._M_p + newOrderSingleRawFIX._M_string_length);
  newOrderSingle.super_Message._56_8_ = 0;
  newOrderSingle.super_Message._64_1_ = 0;
  newOrderSingle.super_Message._80_8_ = 0;
  newOrderSingle.super_Message._88_4_ = 0;
  newOrderSingle.super_Message._0_8_ = &PTR__FieldBase_00323ce8;
  newOrderSingle.super_Message._48_8_ = puVar1;
  std::__cxx11::string::_M_assign((string *)(pSVar4 + 0x218));
  FIX::FieldBase::~FieldBase((FieldBase *)&newOrderSingle);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)newOrderSingleRawFIX._M_dataplus._M_p != &newOrderSingleRawFIX.field_2) {
    operator_delete(newOrderSingleRawFIX._M_dataplus._M_p,
                    CONCAT71(newOrderSingleRawFIX.field_2._M_allocated_capacity._1_7_,
                             newOrderSingleRawFIX.field_2._M_local_buf[0]) + 1);
  }
  FIX42::NewOrderSingle::NewOrderSingle(&newOrderSingle);
  newOrderSingleRawFIX._M_dataplus._M_p = (pointer)&newOrderSingleRawFIX.field_2;
  newOrderSingleRawFIX._M_string_length = 0;
  newOrderSingleRawFIX.field_2._M_local_buf[0] = '\0';
  delimSOH._M_dataplus._M_p = (pointer)&delimSOH.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&delimSOH,"\x01","");
  std::operator+(&local_b80,"8=FIXT.4.2",&delimSOH);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_b80);
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_bb0 = *plVar8;
    lStack_ba8 = plVar5[3];
    local_bc0 = &local_bb0;
  }
  else {
    local_bb0 = *plVar8;
    local_bc0 = (long *)*plVar5;
  }
  local_bb8 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_bc0,(ulong)delimSOH._M_dataplus._M_p);
  local_c00 = &local_bf0;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_bf0 = *plVar8;
    lStack_be8 = plVar5[3];
  }
  else {
    local_bf0 = *plVar8;
    local_c00 = (long *)*plVar5;
  }
  local_bf8 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_c00);
  local_be0 = &local_bd0;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_bd0 = *plVar8;
    lStack_bc8 = plVar5[3];
  }
  else {
    local_bd0 = *plVar8;
    local_be0 = (long *)*plVar5;
  }
  local_bd8 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_be0,(ulong)delimSOH._M_dataplus._M_p);
  local_dc0 = &local_db0;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_db0 = *plVar8;
    lStack_da8 = plVar5[3];
  }
  else {
    local_db0 = *plVar8;
    local_dc0 = (long *)*plVar5;
  }
  local_db8 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_dc0);
  local_da0 = &local_d90;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_d90 = *plVar8;
    lStack_d88 = plVar5[3];
  }
  else {
    local_d90 = *plVar8;
    local_da0 = (long *)*plVar5;
  }
  local_d98 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_da0,(ulong)delimSOH._M_dataplus._M_p);
  local_d80 = &local_d70;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_d70 = *plVar8;
    lStack_d68 = plVar5[3];
  }
  else {
    local_d70 = *plVar8;
    local_d80 = (long *)*plVar5;
  }
  local_d78 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_d80);
  local_d60 = &local_d50;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_d50 = *plVar8;
    lStack_d48 = plVar5[3];
  }
  else {
    local_d50 = *plVar8;
    local_d60 = (long *)*plVar5;
  }
  local_d58 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_d60,(ulong)delimSOH._M_dataplus._M_p);
  local_d40 = &local_d30;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_d30 = *plVar8;
    lStack_d28 = plVar5[3];
  }
  else {
    local_d30 = *plVar8;
    local_d40 = (long *)*plVar5;
  }
  local_d38 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_d40);
  local_d20 = &local_d10;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_d10 = *plVar8;
    lStack_d08 = plVar5[3];
  }
  else {
    local_d10 = *plVar8;
    local_d20 = (long *)*plVar5;
  }
  local_d18 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_d20,(ulong)delimSOH._M_dataplus._M_p);
  local_d00 = &local_cf0;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_cf0 = *plVar8;
    lStack_ce8 = plVar5[3];
  }
  else {
    local_cf0 = *plVar8;
    local_d00 = (long *)*plVar5;
  }
  local_cf8 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_d00);
  local_ce0 = &local_cd0;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_cd0 = *plVar8;
    lStack_cc8 = plVar5[3];
  }
  else {
    local_cd0 = *plVar8;
    local_ce0 = (long *)*plVar5;
  }
  local_cd8 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_ce0,(ulong)delimSOH._M_dataplus._M_p);
  local_cc0 = &local_cb0;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_cb0 = *plVar8;
    lStack_ca8 = plVar5[3];
  }
  else {
    local_cb0 = *plVar8;
    local_cc0 = (long *)*plVar5;
  }
  local_cb8 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_cc0);
  local_ca0 = &local_c90;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_c90 = *plVar8;
    lStack_c88 = plVar5[3];
  }
  else {
    local_c90 = *plVar8;
    local_ca0 = (long *)*plVar5;
  }
  local_c98 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_ca0,(ulong)delimSOH._M_dataplus._M_p);
  local_c80 = &local_c70;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_c70 = *plVar8;
    lStack_c68 = plVar5[3];
  }
  else {
    local_c70 = *plVar8;
    local_c80 = (long *)*plVar5;
  }
  local_c78 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_c80);
  local_c60 = &local_c50;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_c50 = *plVar8;
    lStack_c48 = plVar5[3];
  }
  else {
    local_c50 = *plVar8;
    local_c60 = (long *)*plVar5;
  }
  local_c58 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_c60,(ulong)delimSOH._M_dataplus._M_p);
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_b90 = *plVar8;
    lStack_b88 = plVar5[3];
    local_ba0 = &local_b90;
  }
  else {
    local_b90 = *plVar8;
    local_ba0 = (long *)*plVar5;
  }
  local_b98 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_ba0);
  psVar9 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar9) {
    sStack_c30 = *psVar9;
    lStack_c28 = plVar5[3];
    local_c40 = &sStack_c30;
  }
  else {
    sStack_c30 = *psVar9;
    local_c40 = (size_type *)*plVar5;
  }
  local_c38 = (char *)plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_c40,(ulong)delimSOH._M_dataplus._M_p);
  psVar9 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar9) {
    local_df0._16_8_ = *psVar9;
    local_df0._24_8_ = plVar5[3];
    local_df0._0_8_ = local_df0 + 0x10;
  }
  else {
    local_df0._16_8_ = *psVar9;
    local_df0._0_8_ = (size_type *)*plVar5;
  }
  local_df0._8_8_ = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::operator=((string *)&newOrderSingleRawFIX,(string *)local_df0);
  if ((undefined1 *)local_df0._0_8_ != local_df0 + 0x10) {
    operator_delete((void *)local_df0._0_8_,local_df0._16_8_ + 1);
  }
  if (local_c40 != &sStack_c30) {
    operator_delete(local_c40,sStack_c30 + 1);
  }
  if (local_ba0 != &local_b90) {
    operator_delete(local_ba0,local_b90 + 1);
  }
  if (local_c60 != &local_c50) {
    operator_delete(local_c60,local_c50 + 1);
  }
  if (local_c80 != &local_c70) {
    operator_delete(local_c80,local_c70 + 1);
  }
  if (local_ca0 != &local_c90) {
    operator_delete(local_ca0,local_c90 + 1);
  }
  if (local_cc0 != &local_cb0) {
    operator_delete(local_cc0,local_cb0 + 1);
  }
  if (local_ce0 != &local_cd0) {
    operator_delete(local_ce0,local_cd0 + 1);
  }
  if (local_d00 != &local_cf0) {
    operator_delete(local_d00,local_cf0 + 1);
  }
  if (local_d20 != &local_d10) {
    operator_delete(local_d20,local_d10 + 1);
  }
  if (local_d40 != &local_d30) {
    operator_delete(local_d40,local_d30 + 1);
  }
  if (local_d60 != &local_d50) {
    operator_delete(local_d60,local_d50 + 1);
  }
  if (local_d80 != &local_d70) {
    operator_delete(local_d80,local_d70 + 1);
  }
  if (local_da0 != &local_d90) {
    operator_delete(local_da0,local_d90 + 1);
  }
  if (local_dc0 != &local_db0) {
    operator_delete(local_dc0,local_db0 + 1);
  }
  if (local_be0 != &local_bd0) {
    operator_delete(local_be0,local_bd0 + 1);
  }
  if (local_c00 != &local_bf0) {
    operator_delete(local_c00,local_bf0 + 1);
  }
  if (local_bc0 != &local_bb0) {
    operator_delete(local_bc0,local_bb0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b80._M_dataplus._M_p != &local_b80.field_2) {
    operator_delete(local_b80._M_dataplus._M_p,local_b80.field_2._M_allocated_capacity + 1);
  }
  psVar2 = (string *)(this->super_initiatorFixture).super_sessionFixture.object;
  FIX::DateTime::nowUtc();
  local_df0._8_8_ = local_c38;
  local_df0._16_8_ = sStack_c30;
  local_df0._0_8_ = &PTR__DateTime_00324850;
  FIX::Session::next(psVar2,(UtcTimeStamp *)&newOrderSingleRawFIX,SUB81(local_df0,0));
  ppTVar6 = UnitTest::CurrentTest::Results();
  this_00 = *ppTVar6;
  ppTVar7 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails((TestDetails *)local_df0,*ppTVar7,0xa4e);
  UnitTest::TestResults::OnTestFailure
            (this_00,(TestDetails *)local_df0,"Expected exception: \"InvalidMessage\" not thrown");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)delimSOH._M_dataplus._M_p != &delimSOH.field_2) {
    operator_delete(delimSOH._M_dataplus._M_p,delimSOH.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)newOrderSingleRawFIX._M_dataplus._M_p != &newOrderSingleRawFIX.field_2) {
    operator_delete(newOrderSingleRawFIX._M_dataplus._M_p,
                    CONCAT71(newOrderSingleRawFIX.field_2._M_allocated_capacity._1_7_,
                             newOrderSingleRawFIX.field_2._M_local_buf[0]) + 1);
  }
  FIX::Message::~Message((Message *)&newOrderSingle);
  if (pDataDictionary.super___shared_ptr<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (pDataDictionary.super___shared_ptr<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  FIX::DataDictionary::~DataDictionary(&dictionary);
  FIX::DataDictionary::~DataDictionary(&provider.emptyDataDictionary);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>_>
  ::~_Rb_tree(&provider.m_applicationDictionaries._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>_>
               *)&provider);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sessionID.m_frozenString._M_dataplus._M_p != &sessionID.m_frozenString.field_2) {
    operator_delete(sessionID.m_frozenString._M_dataplus._M_p,
                    sessionID.m_frozenString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sessionID.m_sessionQualifier._M_dataplus._M_p != &sessionID.m_sessionQualifier.field_2) {
    operator_delete(sessionID.m_sessionQualifier._M_dataplus._M_p,
                    sessionID.m_sessionQualifier.field_2._M_allocated_capacity + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)&sessionID.m_targetCompID);
  FIX::FieldBase::~FieldBase((FieldBase *)&sessionID.m_senderCompID);
  FIX::FieldBase::~FieldBase((FieldBase *)&sessionID);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, InvalidRawFixTMessage_LogonMessageHeaderOrderInvalid_InvalidMessageException) {

  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );

  SessionID sessionID( BeginString( "FIXT.1.1" ), SenderCompID( "TW" ), TargetCompID( "ISLD" ) );

  TimeRange sessionTime( startTime, endTime, 0, 31);

  DataDictionaryProvider provider;
  provider.addTransportDataDictionary( sessionID.getBeginString(), "../spec/FIXT11.xml" );
  DataDictionary dictionary = provider.getSessionDataDictionary(sessionID.getBeginString());

  std::shared_ptr<DataDictionary> pDataDictionary = std::make_shared<DataDictionary>(dictionary);

  provider.addTransportDataDictionary( sessionID.getBeginString(), pDataDictionary );
  provider.addApplicationDataDictionary(ApplVerID("20"), pDataDictionary);

  object = new Session( *this, factory, sessionID, provider,
      sessionTime, 1, 0 );
  object->setSenderDefaultApplVerID(ApplVerID("20"));
  object->setTargetDefaultApplVerID(ApplVerID("20"));


  FIX42::NewOrderSingle newOrderSingle;
  std::string newOrderSingleRawFIX;
  std::string delimSOH = "\x01";
  newOrderSingleRawFIX = "8=FIXT.4.2" + delimSOH
      + "35=A" + delimSOH
      + "9=114" + delimSOH
      + "34=2" + delimSOH
      + "49=ISLD" + delimSOH
      + "56=TW" + delimSOH
      + "52=20190517-16:08:43" + delimSOH
      + "98=0" + delimSOH
      + "108=1" + delimSOH
      + "10=166" + delimSOH;

  CHECK_THROW(object->next(newOrderSingleRawFIX, UtcTimeStamp()), InvalidMessage);
}